

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::ResizeTest::ResizeTest(ResizeTest *this,EglTestContext *eglTestCtx,ResizeParams *params)

{
  TestLog *log;
  allocator<char> local_41;
  string local_40;
  
  egl::TestCase::TestCase
            (&this->super_TestCase,eglTestCtx,(params->name)._M_dataplus._M_p,
             (params->description)._M_dataplus._M_p);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ResizeTest_01e0ad78;
  tcu::Vector<int,_2>::Vector(&this->m_oldSize,&params->oldSize);
  tcu::Vector<int,_2>::Vector(&this->m_newSize,&params->newSize);
  (this->m_surface).super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>.
  m_data.ptr = (UniqueSurface *)0x0;
  (this->m_context).super_UniqueBase<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_>.
  m_data.ptr = (UniqueContext *)0x0;
  (this->m_nativeWindow).
  super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data.ptr =
       (NativeWindow *)0x0;
  this->m_display = (EGLDisplay)0x0;
  this->m_config = (EGLConfig)0x0;
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this->m_log = log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,glcts::fixed_sample_locations_values + 1,&local_41);
  tcu::ResultCollector::ResultCollector(&this->m_status,log,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  glw::Functions::Functions(&this->m_gl);
  return;
}

Assistant:

ResizeTest	(EglTestContext&		eglTestCtx,
											 const ResizeParams&	params)
									: TestCase	(eglTestCtx,
												 params.name.c_str(),
												 params.description.c_str())
									, m_oldSize	(params.oldSize)
									, m_newSize	(params.newSize)
									, m_display	(EGL_NO_DISPLAY)
									, m_config	(DE_NULL)
									, m_log		(m_testCtx.getLog())
									, m_status	(m_log) {}